

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.h
# Opt level: O2

void __thiscall SetMeaning::Dump(SetMeaning *this,ostream *out)

{
  Activation *pAVar1;
  ostream *poVar2;
  
  if (this->binding_value->kind == MEANING) {
    poVar2 = std::operator<<(out,"(meaning-set ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2," ");
    pAVar1 = (this->binding_value->field_1).activation;
    (*(code *)(pAVar1->parent->field_1).symbol_value)(pAVar1,out);
    std::operator<<(out,")");
    return;
  }
  __assert_fail("binding_value->IsMeaning()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/meaning.h"
                ,0xa6,"virtual void SetMeaning::Dump(std::ostream &)");
}

Assistant:

void Dump(std::ostream &out) override {
    assert(binding_value->IsMeaning());
    out << "(meaning-set " << up_index << " " << right_index << " ";
    binding_value->meaning->Dump(out);
    out << ")";
  }